

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ExpandBlockReferences(DXFImporter *this,Block *bl,BlockMap *blocks_by_name)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pIVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  PolyLine *pPVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer paVar8;
  undefined1 auVar9 [16];
  undefined4 extraout_EAX;
  int iVar10;
  aiVector3D *v;
  const_iterator cVar11;
  PolyLine *this_01;
  Logger *pLVar12;
  pointer paVar13;
  pointer pIVar14;
  undefined8 *puVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  shared_ptr<Assimp::DXF::PolyLine> pl_out;
  long *local_218;
  long local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  value_type local_1a8 [7];
  ios_base local_138 [264];
  
  pIVar14 = (bl->insertions).
            super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar4 = (bl->insertions).
           super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar14 != pIVar4) {
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::find(&blocks_by_name->_M_t,&pIVar14->name);
      if ((_Rb_tree_header *)cVar11._M_node == &(blocks_by_name->_M_t)._M_impl.super__Rb_tree_header
         ) {
        pLVar12 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[41]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [41])"DXF: Failed to resolve block reference: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pIVar14->name)._M_dataplus._M_p,
                   (pIVar14->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; skipping",10);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar12,(char *)local_218);
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        puVar5 = *(undefined8 **)(cVar11._M_node + 2);
        puVar6 = (undefined8 *)puVar5[1];
        for (puVar15 = (undefined8 *)*puVar5; puVar15 != puVar6; puVar15 = puVar15 + 2) {
          pPVar7 = (PolyLine *)*puVar15;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          this_01 = (PolyLine *)operator_new(0xa8);
          DXF::PolyLine::PolyLine(this_01,pPVar7);
          local_1a8[0].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = this_01;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DXF::PolyLine*>
                    (&local_1a8[0].
                      super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,this_01);
          local_1c8 = puVar5[10];
          fVar18 = (float)((ulong)local_1c8 >> 0x20);
          uStack_1c0 = 0;
          fVar16 = *(float *)(puVar5 + 0xb);
          local_1d8 = ZEXT416((uint)fVar16);
          local_1b8._0_4_ = (pIVar14->scale).x;
          local_1b8._4_4_ = (pIVar14->scale).y;
          fVar26 = (pIVar14->scale).z;
          uStack_1b0 = 0;
          fVar17 = pIVar14->angle;
          auVar9._4_4_ = -(uint)((float)local_1b8 != 1.0);
          auVar9._0_4_ = -(uint)(SQRT(fVar16 * fVar16 +
                                      (float)local_1c8 * (float)local_1c8 + fVar18 * fVar18) != 0.0)
          ;
          auVar9._8_4_ = -(uint)(local_1b8._4_4_ != 1.0);
          auVar9._12_4_ = -(uint)(fVar26 != 1.0);
          iVar10 = movmskps(extraout_EAX,auVar9);
          fVar16 = (pIVar14->pos).x;
          local_1f8 = ZEXT416((uint)fVar16);
          fVar18 = (pIVar14->pos).y;
          fVar19 = (pIVar14->pos).z;
          local_1e8 = ZEXT416((uint)fVar19);
          if ((((iVar10 != 0) || (fVar17 != 0.0)) || (NAN(fVar17))) ||
             ((fVar16 = SQRT(fVar19 * fVar19 + fVar16 * fVar16 + fVar18 * fVar18), fVar16 != 0.0 ||
              (NAN(fVar16))))) {
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              pLVar12 = DefaultLogger::get();
              Logger::warn(pLVar12,"DXF: BLOCK rotation not currently implemented");
            }
            paVar13 = ((local_1a8[0].
                        super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar8 = ((local_1a8[0].
                       super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (paVar13 != paVar8) {
              fVar24 = fVar26 * 0.0 + 0.0;
              fVar17 = -(float)local_1d8._0_4_ * 0.0;
              fVar27 = fVar26 + 0.0 + fVar17;
              fVar16 = (float)local_1b8 * 0.0 + 0.0 + 0.0;
              fVar25 = -(float)local_1c8 * 0.0;
              fVar26 = -local_1c8._4_4_ * 0.0;
              fVar19 = fVar25 + (float)local_1b8 + 0.0;
              fVar20 = fVar26 + fVar16;
              fVar28 = local_1b8._4_4_ * 0.0 + 0.0;
              fVar22 = fVar25 + fVar28;
              fVar23 = fVar26 + local_1b8._4_4_ + 0.0;
              fVar25 = fVar24 + fVar25;
              fVar24 = fVar24 + fVar26;
              fVar16 = fVar16 + fVar17;
              fVar28 = fVar28 + fVar17;
              fVar17 = (0.0 - (float)local_1c8) * 0.0;
              fVar21 = (0.0 - local_1c8._4_4_) * 0.0;
              fVar26 = (0.0 - (float)local_1d8._0_4_) * 0.0;
              do {
                fVar1 = paVar13->x;
                fVar2 = paVar13->y;
                fVar3 = paVar13->z;
                paVar13->x = fVar3 * (fVar17 + fVar25 + fVar19 * 0.0 + fVar22 * 0.0) +
                             fVar1 * (fVar19 + fVar22 * 0.0 + fVar25 * 0.0 + fVar17) +
                             fVar2 * (fVar19 * 0.0 + fVar22 + fVar25 * 0.0 + fVar17) +
                             (float)local_1e8._0_4_ * fVar25 +
                             (float)local_1f8._0_4_ * fVar19 + fVar18 * fVar22 +
                             (0.0 - (float)local_1c8);
                paVar13->y = fVar3 * (fVar21 + fVar20 * 0.0 + fVar23 * 0.0 + fVar24) +
                             fVar1 * (fVar20 + fVar23 * 0.0 + fVar24 * 0.0 + fVar21) +
                             fVar2 * (fVar20 * 0.0 + fVar23 + fVar24 * 0.0 + fVar21) +
                             (float)local_1e8._0_4_ * fVar24 +
                             (float)local_1f8._0_4_ * fVar20 + fVar18 * fVar23 +
                             (0.0 - local_1c8._4_4_);
                paVar13->z = (fVar16 + fVar28 * 0.0 + fVar27 * 0.0 + fVar26) * fVar1 +
                             (fVar16 * 0.0 + fVar28 + fVar27 * 0.0 + fVar26) * fVar2 +
                             (fVar16 * 0.0 + fVar28 * 0.0 + fVar27 + fVar26) * fVar3 +
                             fVar27 * (float)local_1e8._0_4_ +
                             fVar28 * fVar18 + (float)local_1f8._0_4_ * fVar16 +
                             (0.0 - (float)local_1d8._0_4_);
                paVar13 = paVar13 + 1;
              } while (paVar13 != paVar8);
            }
          }
          std::
          vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
          ::push_back(&bl->lines,local_1a8);
          if (local_1a8[0].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8[0].
                       super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      pIVar14 = pIVar14 + 1;
    } while (pIVar14 != pIVar4);
  }
  return;
}

Assistant:

void DXFImporter::ExpandBlockReferences(DXF::Block& bl,const DXF::BlockMap& blocks_by_name) {
    for (const DXF::InsertBlock& insert : bl.insertions) {

        // first check if the referenced blocks exists ...
        const DXF::BlockMap::const_iterator it = blocks_by_name.find(insert.name);
        if (it == blocks_by_name.end()) {
            ASSIMP_LOG_ERROR_F("DXF: Failed to resolve block reference: ", insert.name,"; skipping" );
            continue;
        }

        // XXX this would be the place to implement recursive expansion if needed.
        const DXF::Block& bl_src = *(*it).second;

        for (std::shared_ptr<const DXF::PolyLine> pl_in : bl_src.lines) {
            std::shared_ptr<DXF::PolyLine> pl_out = std::shared_ptr<DXF::PolyLine>(new DXF::PolyLine(*pl_in));

            if (bl_src.base.Length() || insert.scale.x!=1.f || insert.scale.y!=1.f || insert.scale.z!=1.f || insert.angle || insert.pos.Length()) {
                // manual coordinate system transformation
                // XXX order
                aiMatrix4x4 trafo, tmp;
                aiMatrix4x4::Translation(-bl_src.base,trafo);
                trafo *= aiMatrix4x4::Scaling(insert.scale,tmp);
                trafo *= aiMatrix4x4::Translation(insert.pos,tmp);

                // XXX rotation currently ignored - I didn't find an appropriate sample model.
                if (insert.angle != 0.f) {
                    ASSIMP_LOG_WARN("DXF: BLOCK rotation not currently implemented");
                }

                for (aiVector3D& v : pl_out->positions) {
                    v *= trafo;
                }
            }

            bl.lines.push_back(pl_out);
        }
    }
}